

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld_page.c
# Opt level: O0

int set_new_page(FIELD *field,_Bool new_page_flag)

{
  int *piVar1;
  FIELD *local_28;
  _Bool new_page_flag_local;
  FIELD *field_local;
  
  local_28 = field;
  if (field == (FIELD *)0x0) {
    local_28 = _nc_Default_Field;
  }
  if (local_28->form == (formnode *)0x0) {
    if (new_page_flag) {
      local_28->status = local_28->status | 4;
    }
    else {
      local_28->status = local_28->status & 0xfffb;
    }
    piVar1 = __errno_location();
    *piVar1 = 0;
    field_local._4_4_ = 0;
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = -4;
    field_local._4_4_ = -4;
  }
  return field_local._4_4_;
}

Assistant:

int set_new_page(FIELD * field, bool new_page_flag)
{
  Normalize_Field(field);
  if (field->form) 
    RETURN(E_CONNECTED);

  if (new_page_flag) 
    field->status |= _NEWPAGE;
  else
    field->status &= ~_NEWPAGE;

  RETURN(E_OK);
}